

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O1

void __thiscall
Units_unitAttributeMultiplier_Test::TestBody(Units_unitAttributeMultiplier_Test *this)

{
  string *psVar1;
  char cVar2;
  char *pcVar3;
  AssertionResult gtest_ar;
  UnitsPtr u;
  double local_80;
  long *local_78 [2];
  long local_68 [2];
  long *local_58;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  long local_48 [2];
  string *local_38;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_30;
  
  libcellml::Units::create();
  local_78[0] = (long *)&DAT_3ff0000000000000;
  local_80 = (double)libcellml::Units::unitAttributeMultiplier((ulong)local_38);
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&local_58,"1.0","u->unitAttributeMultiplier(0)",(double *)local_78,
             &local_80);
  if (local_58._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_78);
    if (local_50.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_50.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x33d,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_80,(Message *)local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_80);
    if (local_78[0] != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_78[0] != (long *)0x0)) {
        (**(code **)(*local_78[0] + 8))();
      }
      local_78[0] = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_50,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  psVar1 = local_38;
  local_58 = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"NewUnit","");
  pcVar3 = "";
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"","");
  libcellml::Units::addUnit(psVar1,(int)&local_58,1.05,17.0,(string *)&DAT_00000004);
  if (local_78[0] != local_68) {
    operator_delete(local_78[0],local_68[0] + 1);
  }
  if (local_58 != local_48) {
    operator_delete(local_58,local_48[0] + 1);
  }
  local_78[0] = (long *)&DAT_4031000000000000;
  local_80 = (double)libcellml::Units::unitAttributeMultiplier((ulong)local_38);
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&local_58,"17.0","u->unitAttributeMultiplier(0)",(double *)local_78,
             &local_80);
  if (local_58._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_78);
    if (local_50.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = ((local_50.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x340,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_80,(Message *)local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_80);
    if (local_78[0] != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_78[0] != (long *)0x0)) {
        (**(code **)(*local_78[0] + 8))();
      }
      local_78[0] = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_50,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_78[0] = (long *)&DAT_3ff0000000000000;
  local_80 = (double)libcellml::Units::unitAttributeMultiplier((ulong)local_38);
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&local_58,"1.0","u->unitAttributeMultiplier(5)",(double *)local_78,
             &local_80);
  if (local_58._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_78);
    if (local_50.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_50.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x341,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_80,(Message *)local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_80);
    if (local_78[0] != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_78[0] != (long *)0x0)) {
        (**(code **)(*local_78[0] + 8))();
      }
      local_78[0] = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_50,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30);
  }
  return;
}

Assistant:

TEST(Units, unitAttributeMultiplier)
{
    libcellml::UnitsPtr u = libcellml::Units::create();

    EXPECT_EQ(1.0, u->unitAttributeMultiplier(0));
    u->addUnit("NewUnit", 4, 1.05, 17.0);

    EXPECT_EQ(17.0, u->unitAttributeMultiplier(0));
    EXPECT_EQ(1.0, u->unitAttributeMultiplier(5));
}